

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::FindOuter(SQVM *this,SQObjectPtr *target,SQObjectPtr *stackindex)

{
  SQObjectPtr *in_RDX;
  long in_RDI;
  SQOuter *otr;
  SQOuter *p;
  SQOuter **pp;
  SQObjectPtr *in_stack_ffffffffffffff78;
  SQSharedState *in_stack_ffffffffffffff80;
  SQObjectPtr *pSVar1;
  SQObjectPtr *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar2;
  SQObjectPtr local_60 [2];
  SQObjectPtr local_40;
  SQOuter *local_30;
  SQOuter *local_28;
  SQOuter **local_20;
  SQObjectPtr *local_18;
  
  local_20 = (SQOuter **)(in_RDI + 0x58);
  while( true ) {
    local_28 = *local_20;
    uVar2 = false;
    if (local_28 != (SQOuter *)0x0) {
      uVar2 = in_RDX <= local_28->_valptr;
    }
    if ((bool)uVar2 == false) break;
    if (local_28->_valptr == in_RDX) {
      pSVar1 = &local_40;
      ::SQObjectPtr::SQObjectPtr(pSVar1,local_28);
      ::SQObjectPtr::operator=((SQObjectPtr *)CONCAT17(uVar2,in_stack_ffffffffffffff90),pSVar1);
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff80);
      return;
    }
    local_20 = &local_28->_next;
  }
  local_18 = in_RDX;
  local_30 = SQOuter::Create(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_30->_next = *local_20;
  local_30->_idx = (long)local_18 - *(long *)(in_RDI + 0x30) >> 4;
  (local_30->super_SQCollectable).super_SQRefCounted._uiRef =
       (local_30->super_SQCollectable).super_SQRefCounted._uiRef + 1;
  *local_20 = local_30;
  pSVar1 = local_60;
  ::SQObjectPtr::SQObjectPtr(pSVar1,local_30);
  ::SQObjectPtr::operator=
            ((SQObjectPtr *)CONCAT17(uVar2,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88);
  ::SQObjectPtr::~SQObjectPtr(pSVar1);
  return;
}

Assistant:

void SQVM::FindOuter(SQObjectPtr &target, SQObjectPtr *stackindex)
{
    SQOuter **pp = &_openouters;
    SQOuter *p;
    SQOuter *otr;

    while ((p = *pp) != NULL && p->_valptr >= stackindex) {
        if (p->_valptr == stackindex) {
            target = SQObjectPtr(p);
            return;
        }
        pp = &p->_next;
    }
    otr = SQOuter::Create(_ss(this), stackindex);
    otr->_next = *pp;
    otr->_idx  = (stackindex - _stack._vals);
    __ObjAddRef(otr);
    *pp = otr;
    target = SQObjectPtr(otr);
}